

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::TruncCase::compare(TruncCase *this,void **inputs,void **outputs)

{
  float fVar1;
  Precision PVar2;
  pointer pSVar3;
  uint uVar4;
  ostream *poVar5;
  ostringstream *poVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  ulong uVar13;
  float fVar14;
  deUint32 u32;
  deUint32 bBits;
  float fVar15;
  Hex<8UL> local_48;
  HexFloat local_3c;
  float local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar2 = (pSVar3->varType).m_data.basic.precision;
  uVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (PVar2 - PRECISION_MEDIUMP < 2) {
    if (0 < (int)uVar4) {
      uVar13 = 0;
      do {
        fVar11 = *(float *)((long)*inputs + uVar13 * 4);
        if ((int)fVar11 < 0) {
          local_38 = -(float)(int)-fVar11;
          uStack_34 = 0x80000000;
          uStack_30 = 0x80000000;
          uStack_2c = 0x80000000;
        }
        else {
          local_38 = (float)(int)fVar11;
          uStack_34 = 0;
          uStack_30 = 0;
          uStack_2c = 0;
        }
        fVar14 = *(float *)((long)*outputs + uVar13 * 4);
        if (((fVar14 == 0.0) && (fVar11 = local_38, !NAN(fVar14))) ||
           ((local_38 == 0.0 && (fVar11 = fVar14, !NAN(local_38))))) {
          fVar11 = ABS(fVar11);
        }
        else {
          fVar11 = (float)((int)local_38 - (int)fVar14);
          if ((uint)local_38 < (uint)fVar14) {
            fVar11 = (float)-((int)local_38 - (int)fVar14);
          }
        }
        if (fVar11 != 0.0) {
          poVar6 = &(this->super_CommonFunctionCase).m_failMsg;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"Expected [",10);
          poVar5 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = ",4);
          local_3c.value = local_38;
          poVar5 = Functional::operator<<(poVar5,&local_3c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", got ULP diff ",0xf);
LAB_00469d39:
          local_48.value = (deUint64)(uint)fVar11;
          tcu::Format::Hex<8UL>::toStream(&local_48,poVar5);
          return false;
        }
        uVar13 = uVar13 + 1;
      } while (uVar4 != uVar13);
    }
  }
  else {
    uVar8 = -1 << (0x17 - (&DAT_0096a1bc)[(ulong)PVar2 * 4] & 0x1f);
    if (0 < (int)uVar4) {
      fVar11 = (float)~uVar8;
      fVar14 = (float)(uVar8 & 0x7fffff ^ 0x3fffffff) + -1.0;
      uVar13 = 0;
      do {
        fVar1 = *(float *)((long)*inputs + uVar13 * 4);
        iVar12 = (int)(fVar1 - fVar14);
        iVar7 = (int)(fVar1 + fVar14);
        if (iVar7 < iVar12) {
LAB_00469c43:
          poVar6 = &(this->super_CommonFunctionCase).m_failMsg;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"Expected [",10);
          poVar5 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = [",5);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] with ULP threshold ",0x15);
          goto LAB_00469d39;
        }
        fVar1 = *(float *)((long)*outputs + uVar13 * 4);
        iVar9 = iVar12;
        while( true ) {
          fVar15 = (float)iVar9;
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            fVar10 = ABS(fVar1);
            if (iVar9 != 0) {
              fVar10 = (float)((int)fVar15 - (int)fVar1);
              if ((uint)fVar15 < (uint)fVar1) {
                fVar10 = (float)-((int)fVar15 - (int)fVar1);
              }
            }
          }
          else {
            fVar10 = ABS(fVar15);
          }
          if ((uint)fVar10 <= (uint)fVar11) break;
          iVar9 = iVar9 + 1;
          if (iVar7 < iVar9) goto LAB_00469c43;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar4);
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const bool		isNeg		= tcu::Float32(in0).sign() < 0;
				const float		ref			= isNeg ? (-float(int(-in0))) : float(int(in0));

				// \note: trunc() function definition is a bit broad on negative zeros. Ignore result sign if zero.
				const deUint32	ulpDiff		= getUlpDiffIgnoreZeroSign(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(in0-eps);
				const int		maxRes		= int(in0+eps);
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiffIgnoreZeroSign(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}